

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.h
# Opt level: O0

void __thiscall DSDcc::DSDDstar::DStarHeader::~DStarHeader(DStarHeader *this)

{
  string *in_RDI;
  
  std::__cxx11::string::~string(in_RDI + 0x60);
  std::__cxx11::string::~string(in_RDI + 0x40);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

void clear()
       {
           m_rpt1.clear();
           m_rpt2.clear();
           m_yourSign.clear();
           m_mySign.clear();
           m_rpt1FromHD = false;
           m_rpt2FromHD = false;
           m_yourSignFromHD = false;
           m_mySignFromHD = false;
       }